

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_extract.cpp
# Opt level: O3

void duckdb::ListExtractFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  LogicalTypeId LVar1;
  VectorType VVar2;
  VectorType VVar3;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var4;
  unsigned_long *puVar5;
  anon_union_16_2_67f50693_for_value *paVar6;
  data_ptr_t pdVar7;
  undefined8 uVar8;
  sel_t *psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar10;
  iterator iVar11;
  SelectionVector *pSVar12;
  reference vector;
  reference vector_00;
  Vector *pVVar13;
  idx_t iVar14;
  idx_t iVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  _Head_base<0UL,_unsigned_long_*,_false> _Var17;
  NotImplementedException *this_00;
  long signed_list_length;
  unsigned_long uVar18;
  idx_t iVar19;
  ulong uVar20;
  unsigned_long uVar21;
  ulong uVar22;
  unsigned_long *invalid_idx;
  idx_t *piVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int64_t in_R9;
  idx_t idx_in_entry;
  ulong uVar27;
  ulong uVar28;
  data_ptr_t pdVar29;
  data_ptr_t pdVar30;
  ulong uVar31;
  data_ptr_t pdVar32;
  anon_struct_16_3_d7536bce_for_pointer aVar33;
  string_t sVar34;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  vector<unsigned_long,_true> invalid_offsets;
  optional_idx first_valid_child_idx;
  optional_idx child_offset;
  SelectionVector sel;
  UnifiedVectorFormat list_data;
  UnifiedVectorFormat offsets_data;
  UnifiedVectorFormat child_data;
  idx_t local_188;
  unsigned_long local_160;
  idx_t *local_158;
  iterator iStack_150;
  unsigned_long *local_148;
  data_ptr_t local_140;
  optional_idx local_138;
  optional_idx local_130;
  optional_idx local_128;
  SelectionVector local_120;
  undefined1 local_108 [16];
  SelectionVector local_f8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  local_188 = args->count;
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  LVar1 = (vector->type).id_;
  if (LVar1 != SQLNULL) {
    if (LVar1 != VARCHAR) {
      if (LVar1 != LIST) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_108._0_8_ = local_f8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Specifier type not implemented","");
        NotImplementedException::NotImplementedException(this_00,(string *)local_108);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
      Vector::ToUnifiedFormat(vector,local_188,(UnifiedVectorFormat *)local_108);
      Vector::ToUnifiedFormat(vector_00,local_188,&local_c0);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      pVVar13 = ListVector::GetEntry(vector);
      iVar14 = ListVector::GetListSize(vector);
      Vector::ToUnifiedFormat(pVVar13,iVar14,&local_78);
      SelectionVector::SelectionVector(&local_120,local_188);
      local_158 = (idx_t *)0x0;
      iStack_150._M_current = (idx_t *)0x0;
      local_148 = (unsigned_long *)0x0;
      local_138.index = 0xffffffffffffffff;
      local_160 = 0;
      piVar23 = local_158;
      iVar11._M_current = iStack_150._M_current;
      if (local_188 != 0) {
        do {
          uVar18 = local_160;
          if (*(long *)local_108._0_8_ != 0) {
            uVar18 = (unsigned_long)*(uint *)(*(long *)local_108._0_8_ + local_160 * 4);
          }
          uVar21 = local_160;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (unsigned_long)(local_c0.sel)->sel_vector[local_160];
          }
          if ((((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
              ((*(ulong *)((long)local_f8[0].sel_vector + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f) & 1)
               != 0)) &&
             ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)))) {
            lVar24 = *(long *)(local_c0.data + uVar21 * 8);
            if (lVar24 == 0) {
LAB_010164f4:
              local_130.index = 0xffffffffffffffff;
            }
            else {
              uVar25 = lVar24 - (ulong)(0 < lVar24);
              if ((long)uVar25 < 0) {
                uVar25 = uVar25 + *(ulong *)(local_108._8_8_ + uVar18 * 0x10 + 8);
                if ((long)uVar25 < 0) goto LAB_010164f4;
              }
              else if (*(ulong *)(local_108._8_8_ + uVar18 * 0x10 + 8) <= uVar25) goto LAB_010164f4;
              optional_idx::optional_idx
                        (&local_128,uVar25 + *(long *)(local_108._8_8_ + uVar18 * 0x10));
              pSVar12 = local_78.sel;
              local_130.index = local_128.index;
              if (local_128.index != 0xffffffffffffffff) {
                iVar14 = optional_idx::GetIndex(&local_130);
                _Var4._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                     (((unsafe_unique_array<unsigned_long> *)&pSVar12->sel_vector)->
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var4._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  iVar14 = (idx_t)*(uint *)((long)_Var4._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + iVar14 * 4);
                }
                local_120.sel_vector[local_160] = (sel_t)iVar14;
                if (local_138.index == 0xffffffffffffffff) {
                  optional_idx::optional_idx(&local_128,iVar14);
                  local_138.index = local_128.index;
                }
                goto LAB_010165d7;
              }
            }
            if (iStack_150._M_current == local_148) {
              ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_158,
                         iStack_150,&local_160);
            }
            else {
LAB_0101651c:
              *iStack_150._M_current = local_160;
              iStack_150._M_current = iStack_150._M_current + 1;
            }
          }
          else {
            if (iStack_150._M_current != local_148) goto LAB_0101651c;
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_158,iStack_150,
                       &local_160);
          }
LAB_010165d7:
          iVar11._M_current = iStack_150._M_current;
          local_160 = local_160 + 1;
        } while (local_160 < local_188);
        piVar23 = local_158;
        if (local_138.index != 0xffffffffffffffff) {
          if (local_158 != iStack_150._M_current) {
            do {
              iVar14 = *piVar23;
              iVar15 = optional_idx::GetIndex(&local_138);
              local_120.sel_vector[iVar14] = (sel_t)iVar15;
              piVar23 = piVar23 + 1;
            } while (piVar23 != iVar11._M_current);
          }
          VectorOperations::Copy(pVVar13,result,&local_120,local_188,0,0);
          piVar23 = local_158;
          iVar11._M_current = iStack_150._M_current;
        }
      }
      for (; piVar23 != iVar11._M_current; piVar23 = piVar23 + 1) {
        FlatVector::SetNull(result,*piVar23,true);
      }
      if ((local_188 == 1) ||
         ((vector->vector_type == CONSTANT_VECTOR && (vector_00->vector_type == CONSTANT_VECTOR))))
      {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      Vector::Verify(result,local_188);
      if (local_158 != (idx_t *)0x0) {
        operator_delete(local_158);
      }
      if (local_120.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_120.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
LAB_0101680d:
      if (local_c0.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
      }
      if (local_f8[0].selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8[0].selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      return;
    }
    VVar2 = vector->vector_type;
    VVar3 = vector_00->vector_type;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      paVar6 = (anon_union_16_2_67f50693_for_value *)result->data;
      if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
         ((puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
          puVar5 == (unsigned_long *)0x0 || ((*puVar5 & 1) != 0)))) {
        sVar34.value.pointer.ptr = (char *)*(undefined8 *)vector_00->data;
        sVar34.value._0_8_ = *(undefined8 *)(vector->data + 8);
        aVar33 = (anon_struct_16_3_d7536bce_for_pointer)
                 SubstringUnicode((duckdb *)result,*(Vector **)vector->data,sVar34,1,in_R9);
        paVar6->pointer = aVar33;
        return;
      }
      goto LAB_01016756;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar29 = vector_00->data;
      puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar7 = vector->data;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar30 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_188 == 0) {
            return;
          }
          uVar8 = *(undefined8 *)pdVar29;
          lVar24 = 8;
          do {
            input_04.value.pointer.ptr = (char *)uVar8;
            input_04.value._0_8_ = *(undefined8 *)(pdVar7 + lVar24);
            sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar7 + lVar24 + -8),input_04,1
                                      ,in_R9);
            *(long *)(pdVar30 + lVar24 + -8) = sVar34.value._0_8_;
            *(long *)(pdVar30 + lVar24) = sVar34.value._8_8_;
            lVar24 = lVar24 + 0x10;
            local_188 = local_188 - 1;
          } while (local_188 != 0);
          return;
        }
        if (local_188 + 0x3f < 0x40) {
          return;
        }
        uVar22 = 0;
        uVar25 = 0;
        do {
          puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar20 = uVar25 + 0x40;
            if (local_188 <= uVar25 + 0x40) {
              uVar20 = local_188;
            }
LAB_0101697f:
            uVar26 = uVar25;
            if (uVar25 < uVar20) {
              uVar8 = *(undefined8 *)pdVar29;
              uVar28 = uVar25 << 4 | 8;
              do {
                input_00.value.pointer.ptr = (char *)uVar8;
                input_00.value._0_8_ = *(undefined8 *)(pdVar7 + uVar28);
                sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar7 + (uVar28 - 8)),
                                          input_00,1,in_R9);
                *(long *)(pdVar30 + (uVar28 - 8)) = sVar34.value._0_8_;
                *(long *)(pdVar30 + uVar28) = sVar34.value._8_8_;
                uVar25 = uVar25 + 1;
                uVar28 = uVar28 + 0x10;
                uVar26 = uVar20;
              } while (uVar20 != uVar25);
            }
          }
          else {
            uVar28 = puVar5[uVar22];
            uVar20 = uVar25 + 0x40;
            if (local_188 <= uVar25 + 0x40) {
              uVar20 = local_188;
            }
            uVar26 = uVar20;
            if (uVar28 != 0) {
              if (uVar28 == 0xffffffffffffffff) goto LAB_0101697f;
              uVar26 = uVar25;
              if (uVar25 < uVar20) {
                uVar31 = uVar25 << 4 | 8;
                uVar27 = 0;
                do {
                  if ((uVar28 >> (uVar27 & 0x3f) & 1) != 0) {
                    input.value.pointer.ptr = (char *)*(undefined8 *)pdVar29;
                    input.value._0_8_ = *(undefined8 *)(pdVar7 + uVar31);
                    sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar7 + (uVar31 - 8)),
                                              input,1,in_R9);
                    *(long *)(pdVar30 + (uVar31 - 8)) = sVar34.value._0_8_;
                    *(long *)(pdVar30 + uVar31) = sVar34.value._8_8_;
                  }
                  uVar27 = uVar27 + 1;
                  uVar31 = uVar31 + 0x10;
                  uVar26 = uVar20;
                } while (uVar20 - uVar25 != uVar27);
              }
            }
          }
          uVar22 = uVar22 + 1;
          uVar25 = uVar26;
          if (uVar22 == local_188 + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      goto LAB_01016756;
    }
    if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
      if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
        pdVar29 = vector->data;
        pdVar7 = vector_00->data;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar30 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        FlatVector::VerifyFlatVector(vector_00);
        ValidityMask::Combine(&result->validity,&vector_00->validity,local_188);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_188 == 0) {
            return;
          }
          lVar24 = 0;
          do {
            input_09.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + lVar24);
            input_09.value._0_8_ = *(undefined8 *)(pdVar29 + lVar24 * 2 + 8);
            sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar29 + lVar24 * 2),input_09,1
                                      ,in_R9);
            *(long *)(pdVar30 + lVar24 * 2) = sVar34.value._0_8_;
            *(long *)(pdVar30 + lVar24 * 2 + 8) = sVar34.value._8_8_;
            lVar24 = lVar24 + 8;
            local_188 = local_188 - 1;
          } while (local_188 != 0);
          return;
        }
        if (local_188 + 0x3f < 0x40) {
          return;
        }
        pdVar32 = (data_ptr_t)(local_188 + 0x3f >> 6);
        uVar22 = 0;
        uVar25 = 0;
        local_140 = pdVar32;
        do {
          puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar20 = uVar25 + 0x40;
            if (local_188 <= uVar25 + 0x40) {
              uVar20 = local_188;
            }
LAB_01016e9e:
            uVar26 = uVar25;
            if (uVar25 < uVar20) {
              uVar28 = uVar25 << 4 | 8;
              do {
                input_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + uVar25 * 8);
                input_06.value._0_8_ = *(undefined8 *)(pdVar29 + uVar28);
                sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar29 + (uVar28 - 8)),
                                          input_06,1,in_R9);
                *(long *)(pdVar30 + (uVar28 - 8)) = sVar34.value._0_8_;
                *(long *)(pdVar30 + uVar28) = sVar34.value._8_8_;
                uVar25 = uVar25 + 1;
                uVar28 = uVar28 + 0x10;
                pdVar32 = local_140;
                uVar26 = uVar20;
              } while (uVar20 != uVar25);
            }
          }
          else {
            uVar28 = puVar5[uVar22];
            uVar20 = uVar25 + 0x40;
            if (local_188 <= uVar25 + 0x40) {
              uVar20 = local_188;
            }
            uVar26 = uVar20;
            if (uVar28 != 0) {
              if (uVar28 == 0xffffffffffffffff) goto LAB_01016e9e;
              uVar26 = uVar25;
              if (uVar25 < uVar20) {
                uVar31 = uVar25 << 4 | 8;
                uVar27 = 0;
                do {
                  if ((uVar28 >> (uVar27 & 0x3f) & 1) != 0) {
                    input_05.value.pointer.ptr =
                         (char *)*(undefined8 *)(pdVar7 + uVar27 * 8 + uVar25 * 8);
                    input_05.value._0_8_ = *(undefined8 *)(pdVar29 + uVar31);
                    sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar29 + (uVar31 - 8)),
                                              input_05,1,in_R9);
                    *(long *)(pdVar30 + (uVar31 - 8)) = sVar34.value._0_8_;
                    *(long *)(pdVar30 + uVar31) = sVar34.value._8_8_;
                  }
                  uVar27 = uVar27 + 1;
                  uVar31 = uVar31 + 0x10;
                  pdVar32 = local_140;
                  uVar26 = uVar20;
                } while (uVar20 - uVar25 != uVar27);
              }
            }
          }
          uVar22 = uVar22 + 1;
          uVar25 = uVar26;
          if ((data_ptr_t)uVar22 == pdVar32) {
            return;
          }
        } while( true );
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
      Vector::ToUnifiedFormat(vector,local_188,(UnifiedVectorFormat *)local_108);
      Vector::ToUnifiedFormat(vector_00,local_188,&local_c0);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar29 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 && (unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) {
        if (local_188 != 0) {
          lVar24 = *(long *)local_108._0_8_;
          psVar9 = (local_c0.sel)->sel_vector;
          pdVar29 = pdVar29 + 8;
          iVar14 = 0;
          do {
            iVar15 = iVar14;
            if (lVar24 != 0) {
              iVar15 = (idx_t)*(uint *)(lVar24 + iVar14 * 4);
            }
            iVar19 = iVar14;
            if (psVar9 != (sel_t *)0x0) {
              iVar19 = (idx_t)psVar9[iVar14];
            }
            input_01.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar19 * 8);
            input_01.value._0_8_ = *(undefined8 *)(local_108._8_8_ + iVar15 * 0x10 + 8);
            sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(local_108._8_8_ + iVar15 * 0x10)
                                      ,input_01,1,in_R9);
            *(long *)(pdVar29 + -8) = sVar34.value._0_8_;
            *(long *)pdVar29 = sVar34.value._8_8_;
            iVar14 = iVar14 + 1;
            pdVar29 = pdVar29 + 0x10;
          } while (local_188 != iVar14);
        }
      }
      else if (local_188 != 0) {
        lVar24 = *(long *)local_108._0_8_;
        psVar9 = (local_c0.sel)->sel_vector;
        pdVar29 = pdVar29 + 8;
        uVar25 = 0;
        do {
          uVar22 = uVar25;
          if (lVar24 != 0) {
            uVar22 = (ulong)*(uint *)(lVar24 + uVar25 * 4);
          }
          uVar20 = uVar25;
          if (psVar9 != (sel_t *)0x0) {
            uVar20 = (ulong)psVar9[uVar25];
          }
          if ((((unsigned_long *)local_f8[0].sel_vector == (unsigned_long *)0x0) ||
              ((*(ulong *)((long)local_f8[0].sel_vector + (uVar22 >> 6) * 8) >> (uVar22 & 0x3f) & 1)
               != 0)) &&
             ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)))) {
            input_07.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + uVar20 * 8);
            input_07.value._0_8_ = *(undefined8 *)(local_108._8_8_ + uVar22 * 0x10 + 8);
            sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)(local_108._8_8_ + uVar22 * 0x10)
                                      ,input_07,1,in_R9);
            *(long *)(pdVar29 + -8) = sVar34.value._0_8_;
            *(long *)pdVar29 = sVar34.value._8_8_;
          }
          else {
            _Var17._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var17._M_head_impl == (unsigned_long *)0x0) {
              local_120.sel_vector =
                   (sel_t *)(result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_78,(unsigned_long *)&local_120);
              pdVar7 = local_78.data;
              pSVar12 = local_78.sel;
              local_78.sel = (SelectionVector *)0x0;
              local_78.data = (data_ptr_t)0x0;
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar7;
              if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
              }
              pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var17._M_head_impl =
                   (pTVar16->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var17._M_head_impl;
            }
            bVar10 = (byte)uVar25 & 0x3f;
            _Var17._M_head_impl[uVar25 >> 6] =
                 _Var17._M_head_impl[uVar25 >> 6] &
                 (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
          }
          uVar25 = uVar25 + 1;
          pdVar29 = pdVar29 + 0x10;
        } while (local_188 != uVar25);
      }
      goto LAB_0101680d;
    }
    pdVar29 = vector->data;
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar7 = vector_00->data;
    if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar30 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(vector_00);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (local_188 == 0) {
          return;
        }
        pVVar13 = *(Vector **)pdVar29;
        uVar8 = *(undefined8 *)(pdVar29 + 8);
        pdVar30 = pdVar30 + 8;
        iVar14 = 0;
        do {
          input_08.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + iVar14 * 8);
          input_08.value._0_8_ = uVar8;
          sVar34 = SubstringUnicode((duckdb *)result,pVVar13,input_08,1,in_R9);
          *(long *)(pdVar30 + -8) = sVar34.value._0_8_;
          *(long *)pdVar30 = sVar34.value._8_8_;
          iVar14 = iVar14 + 1;
          pdVar30 = pdVar30 + 0x10;
        } while (local_188 != iVar14);
        return;
      }
      if (local_188 + 0x3f < 0x40) {
        return;
      }
      pdVar30 = pdVar30 + 8;
      uVar22 = 0;
      uVar25 = 0;
      local_140 = pdVar30;
      do {
        puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          uVar20 = uVar25 + 0x40;
          if (local_188 <= uVar25 + 0x40) {
            uVar20 = local_188;
          }
LAB_01016c50:
          uVar26 = uVar25;
          if (uVar25 < uVar20) {
            pVVar13 = *(Vector **)pdVar29;
            uVar8 = *(undefined8 *)(pdVar29 + 8);
            pdVar32 = pdVar30 + uVar25 * 0x10;
            do {
              input_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + uVar25 * 8);
              input_03.value._0_8_ = uVar8;
              sVar34 = SubstringUnicode((duckdb *)result,pVVar13,input_03,1,in_R9);
              *(long *)(pdVar32 + -8) = sVar34.value._0_8_;
              *(long *)pdVar32 = sVar34.value._8_8_;
              uVar25 = uVar25 + 1;
              pdVar32 = pdVar32 + 0x10;
              uVar26 = uVar20;
              pdVar30 = local_140;
            } while (uVar20 != uVar25);
          }
        }
        else {
          uVar28 = puVar5[uVar22];
          uVar20 = uVar25 + 0x40;
          if (local_188 <= uVar25 + 0x40) {
            uVar20 = local_188;
          }
          uVar26 = uVar20;
          if (uVar28 != 0) {
            if (uVar28 == 0xffffffffffffffff) goto LAB_01016c50;
            uVar26 = uVar25;
            if (uVar25 < uVar20) {
              pdVar32 = pdVar30 + uVar25 * 0x10;
              uVar27 = 0;
              do {
                if ((uVar28 >> (uVar27 & 0x3f) & 1) != 0) {
                  input_02.value.pointer.ptr =
                       (char *)*(undefined8 *)(pdVar7 + uVar27 * 8 + uVar25 * 8);
                  input_02.value._0_8_ = *(undefined8 *)(pdVar29 + 8);
                  sVar34 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar29,input_02,1,in_R9);
                  *(long *)(pdVar32 + -8) = sVar34.value._0_8_;
                  *(long *)pdVar32 = sVar34.value._8_8_;
                }
                uVar27 = uVar27 + 1;
                pdVar32 = pdVar32 + 0x10;
                uVar26 = uVar20;
              } while (uVar20 - uVar25 != uVar27);
            }
          }
        }
        uVar22 = uVar22 + 1;
        uVar25 = uVar26;
        if (uVar22 == local_188 + 0x3f >> 6) {
          return;
        }
      } while( true );
    }
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
LAB_01016756:
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ListExtractFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto count = args.size();

	Vector &base = args.data[0];
	Vector &subscript = args.data[1];

	switch (base.GetType().id()) {
	case LogicalTypeId::LIST:
		ExecuteListExtract(result, base, subscript, count);
		break;
	case LogicalTypeId::VARCHAR:
		ExecuteStringExtract(result, base, subscript, count);
		break;
	case LogicalTypeId::SQLNULL:
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented");
	}
}